

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt __thiscall slang::SVInt::modPow(SVInt *this,SVInt *base,SVInt *exponent,bool bothSigned)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  bitwidth_t bVar5;
  bitwidth_t bVar6;
  byte bVar7;
  undefined7 in_register_00000009;
  SVInt *pSVar8;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar9;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar10;
  uint uVar11;
  ulong uVar12;
  SVInt *extraout_RDX;
  SVInt *pSVar13;
  SVInt *extraout_RDX_00;
  SVInt *extraout_RDX_01;
  SVInt *extraout_RDX_02;
  uint uVar14;
  int iVar15;
  uint64_t uVar16;
  SVInt SVar17;
  SVInt baseCopy;
  SVInt *result;
  TempBuffer<unsigned_long,_128UL> scratch;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_478;
  uint local_470;
  byte local_46b;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_468;
  undefined4 local_45c;
  ulong local_458;
  SVInt *local_450;
  ulong local_448;
  uint64_t *local_440;
  ulong local_438;
  uint64_t local_430 [128];
  
  uVar11 = (base->super_SVIntStorage).bitWidth * 2 + 0x3f;
  uVar14 = uVar11 >> 6;
  local_438 = (ulong)uVar14;
  local_468 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this;
  if (uVar11 < 0x2040) {
    local_440 = local_430;
  }
  else {
    local_440 = (uint64_t *)operator_new__((ulong)(uVar14 << 3));
  }
  SVInt((SVInt *)&local_478,&base->super_SVIntStorage);
  SVInt((SVInt *)local_468.pVal,(base->super_SVIntStorage).bitWidth,1,false);
  uVar11 = (exponent->super_SVIntStorage).bitWidth;
  bVar7 = (exponent->super_SVIntStorage).unknownFlag;
  uVar14 = ((uVar11 + 0x3f >> 6) << (bVar7 & 0x1f)) - 1;
  if (uVar14 == 0) {
    uVar12 = 0;
  }
  else {
    local_45c = (undefined4)CONCAT71(in_register_00000009,bothSigned);
    local_458 = (ulong)uVar14;
    uVar12 = 0;
    local_450 = exponent;
    do {
      pSVar13 = (SVInt *)(local_450->super_SVIntStorage).field_0.val;
      pSVar8 = local_450;
      if (((local_450->super_SVIntStorage).unknownFlag & 1U) != 0) {
        pSVar8 = pSVar13;
      }
      if (0x40 < (local_450->super_SVIntStorage).bitWidth) {
        pSVar8 = pSVar13;
      }
      uVar16 = (&(pSVar8->super_SVIntStorage).field_0)[uVar12].val;
      iVar15 = 0x40;
      local_448 = uVar12;
      do {
        if ((uVar16 & 1) != 0) {
          bVar5 = getActiveBits((SVInt *)local_468.pVal);
          bVar6 = getActiveBits((SVInt *)&local_478);
          uVar1 = (bVar6 - 1 >> 6) + 1;
          if (bVar6 == 0) {
            uVar1 = 0;
          }
          uVar2 = (bVar5 - 1 >> 6) + 1;
          if (bVar5 == 0) {
            uVar2 = 0;
          }
          memset(local_440,0,local_438 << 3);
          aVar10 = local_468;
          if ((*(byte *)(local_468.val + 0xd) & 1) != 0) {
            aVar10.val = *local_468.pVal;
          }
          if (0x40 < *(uint *)(local_468.val + 8)) {
            aVar10.val = *local_468.pVal;
          }
          aVar9.pVal = (uint64_t *)&local_478;
          if ((local_46b & 1) != 0) {
            aVar9 = local_478;
          }
          if (0x40 < local_470) {
            aVar9 = local_478;
          }
          mul(local_440,aVar10.pVal,uVar2,aVar9.pVal,uVar1);
          aVar10 = local_468;
          uVar11 = (*(uint *)(local_468.val + 8) + 0x3f >> 6) <<
                   (*(byte *)(local_468.val + 0xd) & 0x1f);
          aVar9 = local_468;
          if ((*(byte *)(local_468.val + 0xd) & 1) != 0) {
            aVar9.pVal = (uint64_t *)*local_468.pVal;
          }
          if (0x40 < *(uint *)(local_468.val + 8)) {
            aVar9.pVal = (uint64_t *)*local_468.pVal;
          }
          if (uVar1 + uVar2 < uVar11) {
            uVar11 = uVar1 + uVar2;
          }
          memcpy(aVar9.pVal,local_440,(ulong)(uVar11 << 3));
          clearUnusedBits((SVInt *)aVar10.pVal);
        }
        bVar5 = getActiveBits((SVInt *)&local_478);
        bVar6 = getActiveBits((SVInt *)&local_478);
        uVar1 = (bVar6 - 1 >> 6) + 1;
        if (bVar6 == 0) {
          uVar1 = 0;
        }
        uVar2 = (bVar5 - 1 >> 6) + 1;
        if (bVar5 == 0) {
          uVar2 = 0;
        }
        memset(local_440,0,local_438 << 3);
        aVar10.pVal = (uint64_t *)&local_478;
        if ((local_46b & 1) != 0) {
          aVar10 = local_478;
        }
        if (0x40 < local_470) {
          aVar10 = local_478;
        }
        mul(local_440,aVar10.pVal,uVar2,aVar10.pVal,uVar1);
        uVar11 = (local_470 + 0x3f >> 6) << (local_46b & 0x1f);
        aVar10.pVal = (uint64_t *)&local_478;
        if ((local_46b & 1) != 0) {
          aVar10 = local_478;
        }
        if (0x40 < local_470) {
          aVar10 = local_478;
        }
        if (uVar1 + uVar2 < uVar11) {
          uVar11 = uVar1 + uVar2;
        }
        memcpy(aVar10.pVal,local_440,(ulong)(uVar11 << 3));
        clearUnusedBits((SVInt *)&local_478);
        uVar16 = uVar16 >> 1;
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
      uVar12 = local_448 + 1;
    } while (uVar12 != local_458);
    uVar11 = (local_450->super_SVIntStorage).bitWidth;
    bVar7 = (local_450->super_SVIntStorage).unknownFlag;
    bothSigned = SUB41(local_45c,0);
    uVar12 = local_458;
    exponent = local_450;
  }
  pSVar13 = (SVInt *)(exponent->super_SVIntStorage).field_0.val;
  if ((bVar7 & 1) != 0) {
    exponent = pSVar13;
  }
  if (0x40 < uVar11) {
    exponent = pSVar13;
  }
  uVar12 = (&(exponent->super_SVIntStorage).field_0)[uVar12].val;
  uVar4 = uVar12;
  while (uVar3 = uVar12, uVar4 != 0) {
    if ((uVar3 & 1) != 0) {
      bVar5 = getActiveBits((SVInt *)local_468.pVal);
      bVar6 = getActiveBits((SVInt *)&local_478);
      uVar1 = (bVar6 - 1 >> 6) + 1;
      if (bVar6 == 0) {
        uVar1 = 0;
      }
      uVar2 = (bVar5 - 1 >> 6) + 1;
      if (bVar5 == 0) {
        uVar2 = 0;
      }
      memset(local_440,0,local_438 << 3);
      aVar10 = local_468;
      if ((*(bool *)(local_468.val + 0xd) & 1U) != 0) {
        aVar10.val = *local_468.pVal;
      }
      if (0x40 < *(bitwidth_t *)(local_468.val + 8)) {
        aVar10.val = *local_468.pVal;
      }
      aVar9.pVal = (uint64_t *)&local_478;
      if ((local_46b & 1) != 0) {
        aVar9 = local_478;
      }
      if (0x40 < local_470) {
        aVar9 = local_478;
      }
      mul(local_440,aVar10.pVal,uVar2,aVar9.pVal,uVar1);
      aVar10 = local_468;
      uVar11 = (*(uint *)(local_468.val + 8) + 0x3f >> 6) << (*(byte *)(local_468.val + 0xd) & 0x1f)
      ;
      aVar9 = local_468;
      if ((*(byte *)(local_468.val + 0xd) & 1) != 0) {
        aVar9.pVal = (uint64_t *)*local_468.pVal;
      }
      if (0x40 < *(uint *)(local_468.val + 8)) {
        aVar9.pVal = (uint64_t *)*local_468.pVal;
      }
      if (uVar1 + uVar2 < uVar11) {
        uVar11 = uVar1 + uVar2;
      }
      memcpy(aVar9.pVal,local_440,(ulong)(uVar11 << 3));
      clearUnusedBits((SVInt *)aVar10.pVal);
      pSVar13 = extraout_RDX;
    }
    if (uVar3 == 1) break;
    bVar5 = getActiveBits((SVInt *)&local_478);
    bVar6 = getActiveBits((SVInt *)&local_478);
    uVar1 = (bVar6 - 1 >> 6) + 1;
    if (bVar6 == 0) {
      uVar1 = 0;
    }
    uVar2 = (bVar5 - 1 >> 6) + 1;
    if (bVar5 == 0) {
      uVar2 = 0;
    }
    memset(local_440,0,local_438 << 3);
    aVar10.pVal = (uint64_t *)&local_478;
    if ((local_46b & 1) != 0) {
      aVar10 = local_478;
    }
    if (0x40 < local_470) {
      aVar10 = local_478;
    }
    mul(local_440,aVar10.pVal,uVar2,aVar10.pVal,uVar1);
    uVar11 = (local_470 + 0x3f >> 6) << (local_46b & 0x1f);
    aVar10.pVal = (uint64_t *)&local_478;
    if ((local_46b & 1) != 0) {
      aVar10 = local_478;
    }
    if (0x40 < local_470) {
      aVar10 = local_478;
    }
    if (uVar1 + uVar2 < uVar11) {
      uVar11 = uVar1 + uVar2;
    }
    memcpy(aVar10.pVal,local_440,(ulong)(uVar11 << 3));
    clearUnusedBits((SVInt *)&local_478);
    pSVar13 = extraout_RDX_00;
    uVar12 = uVar3 >> 1;
    uVar4 = uVar3;
  }
  aVar10 = local_468;
  *(bool *)(local_468.val + 0xc) = bothSigned;
  if (((0x40 < local_470) || ((local_46b & 1) != 0)) &&
     ((uint64_t *)local_478.val != (uint64_t *)0x0)) {
    operator_delete__(local_478.pVal);
    pSVar13 = extraout_RDX_01;
  }
  if ((0x80 < local_438) && (local_440 != (uint64_t *)0x0)) {
    operator_delete__(local_440);
    pSVar13 = extraout_RDX_02;
  }
  SVar17.super_SVIntStorage._8_8_ = pSVar13;
  SVar17.super_SVIntStorage.field_0.val = aVar10.val;
  return (SVInt)SVar17.super_SVIntStorage;
}

Assistant:

SVInt SVInt::modPow(const SVInt& base, const SVInt& exponent, bool bothSigned) {
    // This is based on the modular exponentiation algorithm described here:
    // https://en.wikipedia.org/wiki/Modular_exponentiation
    //
    // The result value will have the same bit width as the lhs. That's the value we'll
    // be using as the modulus in the (a * b) mod m equation.
    // Allocate a temporary scratch buffer that has 2x the number of bits so that we can
    // handle any possible intermediate multiply.
    TempBuffer<uint64_t, 128> scratch(getNumWords(base.bitWidth * 2, false));
    SVInt baseCopy = base;
    SVInt result(base.bitWidth, 1, false);

    auto mulReduce = [&](const SVInt& left, const SVInt& right, SVInt& result) {
        bitwidth_t lhsBits = left.getActiveBits();
        bitwidth_t rhsBits = right.getActiveBits();
        uint32_t lhsWords = !lhsBits ? 0 : whichWord(lhsBits - 1) + 1;
        uint32_t rhsWords = !rhsBits ? 0 : whichWord(rhsBits - 1) + 1;

        scratch.fill(0);
        mul(scratch.get(), left.getRawData(), lhsWords, right.getRawData(), rhsWords);

        uint32_t destWords = lhsWords + rhsWords;
        if (destWords >= result.getNumWords()) {
            memcpy(result.getRawData(), scratch.get(), result.getNumWords() * sizeof(uint64_t));
            result.clearUnusedBits();
        }
        else {
            memcpy(result.getRawData(), scratch.get(), destWords * sizeof(uint64_t));
            result.clearUnusedBits();
        }
    };

    // Loop through each bit of the exponent.
    uint32_t exponentWords = exponent.getNumWords();
    for (uint32_t i = 0; i < exponentWords - 1; i++) {
        uint64_t word = exponent.getRawData()[i];
        for (int j = 0; j < BITS_PER_WORD; j++) {
            if (word & 0x1)
                mulReduce(result, baseCopy, result);
            mulReduce(baseCopy, baseCopy, baseCopy);
            word >>= 1;
        }
    }

    // Unroll the last loop iteration to avoid multiplications
    // when the rest of the exponent bits are zero
    uint64_t word = exponent.getRawData()[exponentWords - 1];
    while (word) {
        if (word & 0x1)
            mulReduce(result, baseCopy, result);
        if (word != 1)
            mulReduce(baseCopy, baseCopy, baseCopy);
        word >>= 1;
    }

    result.setSigned(bothSigned);
    return result;
}